

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

void pospopcnt_u8_sse_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint8_t *puVar12;
  uint64_t uVar13;
  ulong uVar14;
  uint32_t *in_RDX;
  ulong in_RSI;
  longlong lVar16;
  uint8_t *in_RDI;
  longlong lVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i x;
  __m128i x_00;
  __m128i x_01;
  __m128i x_02;
  __m128i x_03;
  __m128i x_04;
  __m128i x_05;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i alVar26;
  __m128i popcnt_h;
  __m128i popcnt_d;
  __m128i popcnt_g;
  __m128i popcnt_c;
  __m128i popcnt_f;
  __m128i popcnt_b;
  __m128i popcnt_e;
  __m128i popcnt_a;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  __m128i r3;
  __m128i r2;
  __m128i r1;
  __m128i r0;
  uint8_t *end;
  __m128i counter8bit_h;
  __m128i counter8bit_g;
  __m128i counter8bit_f;
  __m128i counter8bit_e;
  __m128i counter8bit_d;
  __m128i counter8bit_c;
  __m128i counter8bit_b;
  __m128i counter8bit_a;
  int local;
  __m128i lo_nibble;
  __m128i popcnt_4bit;
  __m128i counter_h;
  __m128i counter_g;
  __m128i counter_f;
  __m128i counter_e;
  __m128i counter_d;
  __m128i counter_c;
  __m128i counter_b;
  __m128i counter_a;
  __m128i zero;
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  int local_89c;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint8_t *local_7d0;
  longlong lVar15;
  
  local_808 = ZEXT816(0);
  local_818 = ZEXT816(0);
  local_828 = ZEXT816(0);
  local_838 = ZEXT816(0);
  local_848 = ZEXT816(0);
  local_858 = ZEXT816(0);
  local_868 = ZEXT816(0);
  local_878 = ZEXT816(0);
  lVar17 = CONCAT71((int7)((ulong)in_RDI >> 8),1);
  lVar16 = CONCAT71((int7)(in_RSI >> 8),2);
  lVar15 = CONCAT71((int7)((ulong)in_RDX >> 8),1);
  auVar2 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar2 = vpinsrb_avx(auVar2,1,2);
  auVar2 = vpinsrb_avx(auVar2,2,3);
  auVar2 = vpinsrb_avx(auVar2,1,4);
  auVar2 = vpinsrb_avx(auVar2,2,5);
  auVar2 = vpinsrb_avx(auVar2,2,6);
  auVar2 = vpinsrb_avx(auVar2,3,7);
  auVar2 = vpinsrb_avx(auVar2,1,8);
  auVar2 = vpinsrb_avx(auVar2,2,9);
  auVar2 = vpinsrb_avx(auVar2,2,10);
  auVar2 = vpinsrb_avx(auVar2,3,0xb);
  auVar2 = vpinsrb_avx(auVar2,2,0xc);
  auVar2 = vpinsrb_avx(auVar2,3,0xd);
  auVar2 = vpinsrb_avx(auVar2,3,0xe);
  auVar2 = vpinsrb_avx(auVar2,4,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
  auVar3 = vpinsrb_avx(auVar3,0xf,2);
  auVar3 = vpinsrb_avx(auVar3,0xf,3);
  auVar3 = vpinsrb_avx(auVar3,0xf,4);
  auVar3 = vpinsrb_avx(auVar3,0xf,5);
  auVar3 = vpinsrb_avx(auVar3,0xf,6);
  auVar3 = vpinsrb_avx(auVar3,0xf,7);
  auVar3 = vpinsrb_avx(auVar3,0xf,8);
  auVar3 = vpinsrb_avx(auVar3,0xf,9);
  auVar3 = vpinsrb_avx(auVar3,0xf,10);
  auVar3 = vpinsrb_avx(auVar3,0xf,0xb);
  auVar3 = vpinsrb_avx(auVar3,0xf,0xc);
  auVar3 = vpinsrb_avx(auVar3,0xf,0xd);
  auVar3 = vpinsrb_avx(auVar3,0xf,0xe);
  auVar3 = vpinsrb_avx(auVar3,0xf,0xf);
  local_89c = 0;
  local_8b8 = ZEXT816(0);
  local_8c8 = ZEXT816(0);
  local_8d8 = ZEXT816(0);
  local_8e8 = ZEXT816(0);
  local_8f8 = ZEXT816(0);
  local_908 = ZEXT816(0);
  local_918 = ZEXT816(0);
  local_928 = ZEXT816(0);
  uVar14 = in_RSI & 0xffffffffffffffc0;
  puVar12 = in_RDI + uVar14;
  for (local_7d0 = in_RDI; local_7d0 != puVar12; local_7d0 = local_7d0 + 0x40) {
    uVar19 = *(undefined8 *)local_7d0;
    uVar23 = *(undefined8 *)(local_7d0 + 8);
    a[1] = lVar16;
    a[0] = lVar17;
    b[1] = uVar14;
    b[0] = lVar15;
    uVar18 = uVar19;
    uVar22 = uVar23;
    alVar26 = sse4_merge1_even(a,b);
    b_00[0] = alVar26[1];
    a_00[1] = lVar16;
    a_00[0] = lVar17;
    b_00[1] = uVar14;
    alVar26 = sse4_merge1_odd(a_00,b_00);
    b_01[0] = alVar26[1];
    a_01[1] = lVar16;
    a_01[0] = lVar17;
    b_01[1] = uVar14;
    alVar26 = sse4_merge1_even(a_01,b_01);
    b_02[0] = alVar26[1];
    a_02[1] = lVar16;
    a_02[0] = lVar17;
    b_02[1] = uVar14;
    alVar26 = sse4_merge1_odd(a_02,b_02);
    b_03[0] = alVar26[1];
    a_03[1] = lVar16;
    a_03[0] = lVar17;
    b_03[1] = uVar14;
    uVar20 = uVar18;
    uVar24 = uVar22;
    alVar26 = sse4_merge2_even(a_03,b_03);
    b_04[0] = alVar26[1];
    a_04[1] = lVar16;
    a_04[0] = lVar17;
    b_04[1] = uVar14;
    uVar21 = uVar19;
    uVar25 = uVar23;
    alVar26 = sse4_merge2_even(a_04,b_04);
    b_05[0] = alVar26[1];
    a_05[1] = lVar16;
    a_05[0] = lVar17;
    b_05[1] = uVar14;
    alVar26 = sse4_merge2_odd(a_05,b_05);
    b_06[0] = alVar26[1];
    a_06[1] = lVar16;
    a_06[0] = lVar17;
    b_06[1] = uVar14;
    alVar26 = sse4_merge2_odd(a_06,b_06);
    lVar15 = alVar26[1];
    auVar4._8_8_ = uVar24;
    auVar4._0_8_ = uVar20;
    auVar1 = vpand_avx(auVar4,auVar3);
    auVar4 = vpshufb_avx(auVar2,auVar1);
    auVar5._8_8_ = uVar24;
    auVar5._0_8_ = uVar20;
    auVar1 = vpsrld_avx(auVar5,ZEXT416(4));
    auVar1 = vpand_avx(auVar1,auVar3);
    auVar5 = vpshufb_avx(auVar2,auVar1);
    auVar6._8_8_ = uVar25;
    auVar6._0_8_ = uVar21;
    auVar1 = vpand_avx(auVar6,auVar3);
    auVar6 = vpshufb_avx(auVar2,auVar1);
    auVar7._8_8_ = uVar25;
    auVar7._0_8_ = uVar21;
    auVar1 = vpsrld_avx(auVar7,ZEXT416(4));
    auVar1 = vpand_avx(auVar1,auVar3);
    auVar7 = vpshufb_avx(auVar2,auVar1);
    auVar8._8_8_ = uVar22;
    auVar8._0_8_ = uVar18;
    auVar1 = vpand_avx(auVar8,auVar3);
    auVar8 = vpshufb_avx(auVar2,auVar1);
    auVar9._8_8_ = uVar22;
    auVar9._0_8_ = uVar18;
    auVar1 = vpsrld_avx(auVar9,ZEXT416(4));
    auVar1 = vpand_avx(auVar1,auVar3);
    auVar9 = vpshufb_avx(auVar2,auVar1);
    auVar1._8_8_ = uVar23;
    auVar1._0_8_ = uVar19;
    auVar1 = vpand_avx(auVar1,auVar3);
    auVar10 = vpshufb_avx(auVar2,auVar1);
    auVar11._8_8_ = uVar23;
    auVar11._0_8_ = uVar19;
    auVar1 = vpsrld_avx(auVar11,ZEXT416(4));
    auVar1 = vpand_avx(auVar1,auVar3);
    auVar1 = vpshufb_avx(auVar2,auVar1);
    local_8b8 = vpaddb_avx(local_8b8,auVar4);
    local_8c8 = vpaddb_avx(local_8c8,auVar6);
    local_8d8 = vpaddb_avx(local_8d8,auVar8);
    local_8e8 = vpaddb_avx(local_8e8,auVar10);
    local_8f8 = vpaddb_avx(local_8f8,auVar5);
    local_908 = vpaddb_avx(local_908,auVar7);
    local_918 = vpaddb_avx(local_918,auVar9);
    local_928 = vpaddb_avx(local_928,auVar1);
    local_89c = local_89c + 1;
    if (local_89c == 0x3f) {
      auVar1 = vpsadbw_avx(local_8b8,ZEXT816(0));
      local_808 = vpaddq_avx(local_808,auVar1);
      local_8b8 = ZEXT816(0);
      auVar1 = vpsadbw_avx(local_8c8,ZEXT816(0));
      local_818 = vpaddq_avx(local_818,auVar1);
      local_8c8 = ZEXT816(0);
      auVar1 = vpsadbw_avx(local_8d8,ZEXT816(0));
      local_828 = vpaddq_avx(local_828,auVar1);
      local_8d8 = ZEXT816(0);
      auVar1 = vpsadbw_avx(local_8e8,ZEXT816(0));
      local_838 = vpaddq_avx(local_838,auVar1);
      local_8e8 = ZEXT816(0);
      auVar1 = vpsadbw_avx(local_8f8,ZEXT816(0));
      local_848 = vpaddq_avx(local_848,auVar1);
      local_8f8 = ZEXT816(0);
      auVar1 = vpsadbw_avx(local_908,ZEXT816(0));
      local_858 = vpaddq_avx(local_858,auVar1);
      local_908 = ZEXT816(0);
      auVar1 = vpsadbw_avx(local_918,ZEXT816(0));
      local_868 = vpaddq_avx(local_868,auVar1);
      local_918 = ZEXT816(0);
      auVar1 = vpsadbw_avx(local_928,ZEXT816(0));
      local_878 = vpaddq_avx(local_878,auVar1);
      local_928 = ZEXT816(0);
      local_89c = 0;
    }
  }
  if (local_89c != 0) {
    auVar2 = vpsadbw_avx(local_8b8,ZEXT816(0));
    vpaddq_avx(local_808,auVar2);
    auVar2 = vpsadbw_avx(local_8c8,ZEXT816(0));
    vpaddq_avx(local_818,auVar2);
    auVar2 = vpsadbw_avx(local_8d8,ZEXT816(0));
    vpaddq_avx(local_828,auVar2);
    auVar2 = vpsadbw_avx(local_8e8,ZEXT816(0));
    vpaddq_avx(local_838,auVar2);
    auVar2 = vpsadbw_avx(local_8f8,ZEXT816(0));
    vpaddq_avx(local_848,auVar2);
    auVar2 = vpsadbw_avx(local_908,ZEXT816(0));
    vpaddq_avx(local_858,auVar2);
    auVar2 = vpsadbw_avx(local_918,ZEXT816(0));
    vpaddq_avx(local_868,auVar2);
    auVar2 = vpsadbw_avx(local_928,ZEXT816(0));
    vpaddq_avx(local_878,auVar2);
  }
  alVar26[1] = lVar16;
  alVar26[0] = lVar17;
  uVar13 = sse4_sum_epu64(alVar26);
  *in_RDX = *in_RDX + (int)uVar13;
  x[1] = lVar16;
  x[0] = lVar17;
  uVar13 = sse4_sum_epu64(x);
  in_RDX[1] = in_RDX[1] + (int)uVar13;
  x_00[1] = lVar16;
  x_00[0] = lVar17;
  uVar13 = sse4_sum_epu64(x_00);
  in_RDX[2] = in_RDX[2] + (int)uVar13;
  x_01[1] = lVar16;
  x_01[0] = lVar17;
  uVar13 = sse4_sum_epu64(x_01);
  in_RDX[3] = in_RDX[3] + (int)uVar13;
  x_02[1] = lVar16;
  x_02[0] = lVar17;
  uVar13 = sse4_sum_epu64(x_02);
  in_RDX[4] = in_RDX[4] + (int)uVar13;
  x_03[1] = lVar16;
  x_03[0] = lVar17;
  uVar13 = sse4_sum_epu64(x_03);
  in_RDX[5] = in_RDX[5] + (int)uVar13;
  x_04[1] = lVar16;
  x_04[0] = lVar17;
  uVar13 = sse4_sum_epu64(x_04);
  in_RDX[6] = in_RDX[6] + (int)uVar13;
  x_05[1] = lVar16;
  x_05[0] = lVar17;
  uVar13 = sse4_sum_epu64(x_05);
  in_RDX[7] = in_RDX[7] + (int)uVar13;
  pospopcnt_u8_scalar_naive(local_7d0,in_RSI & 0x3f,in_RDX);
  return;
}

Assistant:

void pospopcnt_u8_sse_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();

    __m128i counter_a = zero;
    __m128i counter_b = zero;
    __m128i counter_c = zero;
    __m128i counter_d = zero;
    __m128i counter_e = zero;
    __m128i counter_f = zero;
    __m128i counter_g = zero;
    __m128i counter_h = zero;

    const __m128i popcnt_4bit = _mm_setr_epi8(
        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4
    );

    const __m128i lo_nibble = _mm_set1_epi8(0x0f);

    int local = 0;
    __m128i counter8bit_a = zero;
    __m128i counter8bit_b = zero;
    __m128i counter8bit_c = zero;
    __m128i counter8bit_d = zero;
    __m128i counter8bit_e = zero;
    __m128i counter8bit_f = zero;
    __m128i counter8bit_g = zero;
    __m128i counter8bit_h = zero;

    for (const uint8_t* end = &data[(len & ~63)]; data != end; data += 64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m128i r0 = _mm_loadu_si128((__m128i*)&data[0*16]);
        const __m128i r1 = _mm_loadu_si128((__m128i*)&data[1*16]);
        const __m128i r2 = _mm_loadu_si128((__m128i*)&data[2*16]);
        const __m128i r3 = _mm_loadu_si128((__m128i*)&data[3*16]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m128i s0 = sse4_merge1_even(r0, r1);
        const __m128i s1 = sse4_merge1_odd (r0, r1);
        const __m128i s2 = sse4_merge1_even(r2, r3);
        const __m128i s3 = sse4_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m128i d0 = sse4_merge2_even(s0, s2);
        const __m128i d1 = sse4_merge2_even(s1, s3);
        const __m128i d2 = sse4_merge2_odd (s0, s2);
        const __m128i d3 = sse4_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m128i popcnt_a = _mm_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m128i popcnt_e = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d0, 4) & lo_nibble);
        const __m128i popcnt_b = _mm_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m128i popcnt_f = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d1, 4) & lo_nibble);
        const __m128i popcnt_c = _mm_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m128i popcnt_g = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d2, 4) & lo_nibble);
        const __m128i popcnt_d = _mm_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m128i popcnt_h = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm_add_epi64(counter_##n, _mm_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm_setzero_si128();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm_add_epi64(counter_##n, _mm_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += sse4_sum_epu64(counter_a);
    flag_counts[1] += sse4_sum_epu64(counter_b);
    flag_counts[2] += sse4_sum_epu64(counter_c);
    flag_counts[3] += sse4_sum_epu64(counter_d);
    flag_counts[4] += sse4_sum_epu64(counter_e);
    flag_counts[5] += sse4_sum_epu64(counter_f);
    flag_counts[6] += sse4_sum_epu64(counter_g);
    flag_counts[7] += sse4_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 64, flag_counts);
}